

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_escaped_characters(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  reference pcVar2;
  difference_type dVar3;
  invalid_argument *piVar4;
  char cVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  allocator local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  undefined1 local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  uint32_t local_13c;
  int local_138;
  uint32_t res_1;
  int ii_1;
  uint32_t mplier_1;
  uint32_t code_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  uint32_t local_c4;
  int local_c0;
  uint32_t res;
  int ii;
  uint32_t mplier;
  uint32_t code;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  size_type ecloc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator loc;
  string *str_local;
  string *out;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_38._M_current = (char *)::std::__cxx11::string::begin();
  do {
    local_40._M_current = (char *)::std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(&local_38,&local_40);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    cVar5 = (char)__return_storage_ptr__;
    if (*pcVar2 == '\\') {
      local_48._M_current = (char *)::std::__cxx11::string::end();
      dVar3 = __gnu_cxx::operator-(&local_48,&local_38);
      if (dVar3 < 2) {
        ecloc._7_1_ = 1;
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::operator+(&local_68,"invalid escape sequence ",str);
        ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
        ecloc._7_1_ = 0;
        __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      local_80 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_38,1);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_80);
      local_78 = ::std::__cxx11::string::find_first_of('H',(ulong)(uint)(int)*pcVar2);
      if (local_78 == -1) {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_38,1);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        if (*pcVar2 == 'u') {
          local_90._M_current = (char *)::std::__cxx11::string::end();
          dVar3 = __gnu_cxx::operator-(&local_90,&local_38);
          if (dVar3 < 6) {
            mplier._3_1_ = 1;
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &code,"unicode sequence must have 4 hex codes ",str);
            ::std::invalid_argument::invalid_argument(piVar4,(string *)&code);
            mplier._3_1_ = 0;
            __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          ii = 0;
          res = 0x1000;
          for (local_c0 = 2; local_c0 < 6; local_c0 = local_c0 + 1) {
            local_d0 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_38,(long)local_c0);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_d0);
            local_c4 = hexConvert(*pcVar2);
            if (0xf < local_c4) {
              local_f1 = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+(&local_f0,"unicode sequence must have 4 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_f0);
              local_f1 = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            ii = local_c4 * res + ii;
            res = res >> 4;
          }
          append_codepoint(__return_storage_ptr__,ii);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(&local_38,5);
        }
        else {
          local_100 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_38,1);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_100);
          if (*pcVar2 == 'U') {
            local_108._M_current = (char *)::std::__cxx11::string::end();
            dVar3 = __gnu_cxx::operator-(&local_108,&local_38);
            if (dVar3 < 10) {
              mplier_1._3_1_ = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &code_1,"unicode sequence must have 8 hex codes ",str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&code_1);
              mplier_1._3_1_ = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            ii_1 = 0;
            res_1 = 0x10000000;
            for (local_138 = 2; local_138 < 10; local_138 = local_138 + 1) {
              local_148 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(&local_38,(long)local_138);
              pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_148);
              local_13c = hexConvert(*pcVar2);
              if (0xf < local_13c) {
                local_169 = 1;
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+(&local_168,"unicode sequence must have 8 hex codes ",str);
                ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_168);
                local_169 = 0;
                __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              ii_1 = local_13c * res_1 + ii_1;
              res_1 = res_1 >> 4;
            }
            append_codepoint(__return_storage_ptr__,ii_1);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+=(&local_38,9);
          }
          else {
            local_178 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(&local_38,1);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_178);
            if (*pcVar2 != '0') {
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_1f8,"unrecognized escape sequence \\",&local_1f9);
              local_208 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(&local_38,1);
              pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_208);
              ::std::operator+(&local_1d8,&local_1f8,*pcVar2);
              ::std::operator+(&local_1b8,&local_1d8," in ");
              ::std::operator+(&local_198,&local_1b8,str);
              ::std::invalid_argument::invalid_argument(piVar4,(string *)&local_198);
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            ::std::__cxx11::string::push_back(cVar5);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_38);
          }
        }
      }
      else {
        ::std::__cxx11::string::operator[](0x20f628);
        ::std::__cxx11::string::push_back(cVar5);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_38);
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&local_38);
      ::std::__cxx11::string::push_back(cVar5);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}